

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_hmc_multiple_val.cpp
# Opt level: O3

double calc_delh(double *x,double (*A) [3],double (*delh) [3])

{
  int idim;
  long lVar1;
  int jdim;
  long lVar2;
  double dVar3;
  
  (*delh)[0] = 0.0;
  (*delh)[1] = 0.0;
  (*delh)[2] = 0.0;
  lVar1 = 0;
  do {
    dVar3 = (*delh)[lVar1];
    lVar2 = 0;
    do {
      dVar3 = dVar3 + (*A)[lVar2] * x[lVar2];
      (*delh)[lVar1] = dVar3;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar1 = lVar1 + 1;
    A = A + 1;
  } while (lVar1 != 3);
  return 0.0;
}

Assistant:

double calc_delh(const double x[ndim], const double A[ndim][ndim], double (&delh)[ndim]) {
    for (int idim = 0; idim < ndim; idim++) {
        delh[idim] = 0e0;
    }
    for (int idim = 0; idim < ndim; idim++) {
        for (int jdim = 0; jdim < ndim; jdim++) {
            delh[idim] += A[idim][jdim] * x[jdim];
        }
    }
    return 0;
}